

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O2

void __thiscall
arma::Mat<int>::Mat(Mat<int> *this,arma_vec_indicator *param_1,uword in_n_rows,uword in_n_cols,
                   uhword in_vec_state)

{
  this->n_rows = in_n_rows;
  this->n_cols = in_n_cols;
  this->n_elem = in_n_cols * in_n_rows;
  this->n_alloc = 0;
  this->vec_state = in_vec_state;
  this->mem_state = 0;
  this->mem = (int *)0x0;
  init_cold(this);
  return;
}

Assistant:

inline
Mat<eT>::Mat(const arma_vec_indicator&, const uword in_n_rows, const uword in_n_cols, const uhword in_vec_state)
  : n_rows(in_n_rows)
  , n_cols(in_n_cols)
  , n_elem(in_n_rows*in_n_cols)
  , n_alloc()
  , vec_state(in_vec_state)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  init_cold();
  }